

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O3

void anon_unknown.dwarf_1be014::DirectorySearch(char *path,char *ext,vector<std::string> *results)

{
  pointer pbVar1;
  char *pcVar2;
  pointer pbVar3;
  int iVar4;
  LogLevel LVar5;
  DIR *__dirp;
  long lVar6;
  long lVar7;
  size_t sVar8;
  dirent *pdVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Searching %s for *%s\n",path,ext);
  }
  __dirp = opendir(path);
  if (__dirp != (DIR *)0x0) {
    lVar6 = (long)(results->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(results->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = lVar6 >> 5;
    sVar8 = strlen(ext);
    pdVar9 = readdir(__dirp);
    if (pdVar9 != (dirent *)0x0) {
      do {
        if ((pdVar9->d_name[0] != '.') ||
           ((pdVar9->d_name[1] != '\0' &&
            ((pdVar9->d_name[1] != '.' || (pdVar9->d_name[2] != '\0')))))) {
          sVar10 = strlen(pdVar9->d_name);
          if ((sVar8 < sVar10) &&
             (iVar4 = al::strcasecmp(pdVar9->d_name + (sVar10 - sVar8),ext), iVar4 == 0)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
            ::emplace_back<>(results);
            pbVar1 = (results->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pbVar3 = pbVar1 + -1;
            pcVar2 = (char *)pbVar1[-1]._M_string_length;
            strlen(path);
            std::__cxx11::string::_M_replace((ulong)pbVar3,0,pcVar2,(ulong)path);
            if (pbVar1[-1]._M_dataplus._M_p[pbVar1[-1]._M_string_length - 1] != '/') {
              std::__cxx11::string::push_back((char)pbVar3);
            }
            std::__cxx11::string::append((char *)pbVar3);
          }
        }
        pdVar9 = readdir(__dirp);
      } while (pdVar9 != (dirent *)0x0);
    }
    closedir(__dirp);
    pbVar3 = (results->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)(results->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
    uVar11 = lVar14 - lVar7;
    if (uVar11 != 0) {
      lVar6 = (long)pbVar3 + lVar6;
      lVar12 = (lVar14 - lVar7) * 0x20 + lVar6;
      lVar13 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::__introsort_loop<std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar6,lVar12,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar6,lVar12);
      lVar13 = 0;
      LVar5 = gLogLevel;
      do {
        if (2 < (int)LVar5) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (II)  got %s\n",*(undefined8 *)(lVar6 + lVar13));
          LVar5 = gLogLevel;
        }
        lVar13 = lVar13 + 0x20;
      } while (lVar14 * 0x20 + lVar7 * -0x20 != lVar13);
    }
  }
  return;
}

Assistant:

void DirectorySearch(const char *path, const char *ext, al::vector<std::string> *const results)
{
    TRACE("Searching %s for *%s\n", path, ext);
    DIR *dir{opendir(path)};
    if(!dir) return;

    const auto base = results->size();
    const size_t extlen{strlen(ext)};

    while(struct dirent *dirent{readdir(dir)})
    {
        if(strcmp(dirent->d_name, ".") == 0 || strcmp(dirent->d_name, "..") == 0)
            continue;

        const size_t len{strlen(dirent->d_name)};
        if(len <= extlen) continue;
        if(al::strcasecmp(dirent->d_name+len-extlen, ext) != 0)
            continue;

        results->emplace_back();
        std::string &str = results->back();
        str = path;
        if(str.back() != '/')
            str.push_back('/');
        str += dirent->d_name;
    }
    closedir(dir);

    const al::span<std::string> newlist{results->data()+base, results->size()-base};
    std::sort(newlist.begin(), newlist.end());
    for(const auto &name : newlist)
        TRACE(" got %s\n", name.c_str());
}